

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp3_qpack.c
# Opt level: O2

nghttp3_ssize
nghttp3_qpack_decoder_read_encoder(nghttp3_qpack_decoder *decoder,uint8_t *src,size_t srclen)

{
  nghttp3_qpack_read_state *rstate;
  nghttp3_buf *dest;
  nghttp3_rcbuf **rcbuf_ptr;
  nghttp3_rcbuf *pnVar1;
  byte bVar2;
  nghttp3_rcbuf **ppnVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  byte *end;
  nghttp3_ssize nVar8;
  int rfin;
  uint8_t *local_60;
  nghttp3_buf *local_58;
  nghttp3_mem *local_50;
  size_t local_48;
  byte *local_40;
  nghttp3_rcbuf **local_38;
  
  if ((decoder->ctx).bad == '\0') {
    if (srclen == 0) {
      nVar8 = 0;
    }
    else {
      local_50 = (decoder->ctx).mem;
      uVar6 = decoder->uninterrupted_encoderlen + srclen;
      decoder->uninterrupted_encoderlen = uVar6;
      nVar8 = -0x192;
      if (uVar6 < 0x20001) {
        local_40 = src + srclen;
        rstate = &decoder->rstate;
        local_58 = &(decoder->rstate).valuebuf;
        local_38 = &(decoder->rstate).value;
        dest = &(decoder->rstate).namebuf;
        rcbuf_ptr = &(decoder->rstate).name;
        bVar2 = 0;
        end = local_40;
        local_60 = src;
        local_48 = srclen;
switchD_001082e3_default:
        if ((bool)(src == end & (bVar2 ^ 1))) {
          return local_48;
        }
        bVar2 = 0;
        switch(decoder->state) {
        case NGHTTP3_QPACK_ES_STATE_OPCODE:
          goto switchD_001082e3_caseD_0;
        case NGHTTP3_QPACK_ES_STATE_READ_INDEX:
          nVar8 = qpack_read_varint(&rfin,rstate,src,end);
          if (nVar8 < 0) {
            uVar6 = 0xfffffe6e;
            if (nVar8 != -0x6c) {
              __assert_fail("NGHTTP3_ERR_QPACK_FATAL == nread",
                            "/workspace/llm4binary/github/license_c_cmakelists/ngtcp2[P]nghttp3/lib/nghttp3_qpack.c"
                            ,0xb2e,
                            "nghttp3_ssize nghttp3_qpack_decoder_read_encoder(nghttp3_qpack_decoder *, const uint8_t *, size_t)"
                           );
            }
          }
          else {
            src = src + nVar8;
            if (rfin == 0) goto LAB_00108734;
            if (decoder->opcode == NGHTTP3_QPACK_ES_OPCODE_SET_DTABLE_CAP) {
              iVar4 = nghttp3_qpack_decoder_set_max_dtable_capacity(decoder,(decoder->rstate).left);
              if (iVar4 == 0) goto LAB_001085df;
              uVar6 = 0xfffffe6e;
            }
            else {
              uVar5 = nghttp3_qpack_decoder_rel2abs(decoder,rstate);
              uVar6 = (ulong)uVar5;
              if (-1 < (int)uVar5) {
                if (decoder->opcode != NGHTTP3_QPACK_ES_OPCODE_INSERT_INDEXED) {
                  if (decoder->opcode != NGHTTP3_QPACK_ES_OPCODE_DUPLICATE) {
                    nghttp3_unreachable_fail
                              ("nghttp3_qpack.c",0xb5e,"nghttp3_qpack_decoder_read_encoder");
                  }
                  uVar5 = nghttp3_qpack_decoder_dtable_duplicate_add(decoder);
                  uVar6 = (ulong)uVar5;
                  goto LAB_001085d7;
                }
                (decoder->rstate).prefix = 7;
                decoder->state = NGHTTP3_QPACK_ES_STATE_CHECK_VALUE_HUFFMAN;
                bVar2 = 0;
                goto switchD_001082e3_default;
              }
            }
          }
          break;
        case NGHTTP3_QPACK_ES_STATE_CHECK_NAME_HUFFMAN:
          (decoder->rstate).huffman_encoded =
               (uint)((*src >> ((uint)(decoder->rstate).prefix & 0x1f) & 1) != 0);
          decoder->state = NGHTTP3_QPACK_ES_STATE_READ_NAMELEN;
          (decoder->rstate).left = 0;
          (decoder->rstate).shift = 0;
        case NGHTTP3_QPACK_ES_STATE_READ_NAMELEN:
          nVar8 = qpack_read_varint(&rfin,rstate,src,end);
          if (nVar8 < 0) {
            uVar6 = 0xfffffe6e;
            if (nVar8 != -0x6c) {
              __assert_fail("NGHTTP3_ERR_QPACK_FATAL == nread",
                            "/workspace/llm4binary/github/license_c_cmakelists/ngtcp2[P]nghttp3/lib/nghttp3_qpack.c"
                            ,0xb6b,
                            "nghttp3_ssize nghttp3_qpack_decoder_read_encoder(nghttp3_qpack_decoder *, const uint8_t *, size_t)"
                           );
            }
          }
          else {
            src = src + nVar8;
            if (rfin == 0) {
LAB_00108734:
              return (long)src - (long)local_60;
            }
            uVar6 = (decoder->rstate).left;
            if (uVar6 < 0x101) {
              if ((decoder->rstate).huffman_encoded == 0) {
                decoder->state = NGHTTP3_QPACK_ES_STATE_READ_NAME;
              }
              else {
                decoder->state = NGHTTP3_QPACK_ES_STATE_READ_NAME_HUFFMAN;
                nghttp3_qpack_huffman_decode_context_init(&rstate->huffman_ctx);
                uVar6 = (decoder->rstate).left * 2;
              }
              uVar5 = nghttp3_rcbuf_new(rcbuf_ptr,uVar6 + 1,local_50);
              uVar6 = (ulong)uVar5;
              if (uVar5 == 0) {
                pnVar1 = *rcbuf_ptr;
                nghttp3_buf_wrap_init(dest,pnVar1->base,pnVar1->len);
                bVar2 = 0;
                goto switchD_001082e3_default;
              }
            }
            else {
LAB_0010873e:
              uVar6 = 0xffffffffffffff93;
            }
          }
          break;
        case NGHTTP3_QPACK_ES_STATE_READ_NAME_HUFFMAN:
          uVar7 = qpack_read_huffman_string(rstate,dest,src,end);
          if (-1 < (long)uVar7) {
LAB_0010854e:
            src = src + uVar7;
            if ((decoder->rstate).left != 0) goto LAB_00108734;
            qpack_read_state_terminate_name(rstate);
            decoder->state = NGHTTP3_QPACK_ES_STATE_CHECK_VALUE_HUFFMAN;
            (decoder->rstate).prefix = 7;
            bVar2 = 0;
            goto switchD_001082e3_default;
          }
          uVar6 = 0xfffffe6e;
          if (uVar7 != 0xffffffffffffff94) {
            __assert_fail("NGHTTP3_ERR_QPACK_FATAL == nread",
                          "/workspace/llm4binary/github/license_c_cmakelists/ngtcp2[P]nghttp3/lib/nghttp3_qpack.c"
                          ,0xb91,
                          "nghttp3_ssize nghttp3_qpack_decoder_read_encoder(nghttp3_qpack_decoder *, const uint8_t *, size_t)"
                         );
          }
          break;
        case NGHTTP3_QPACK_ES_STATE_READ_NAME:
          uVar6 = qpack_read_string(rstate,dest,src,end);
          uVar7 = uVar6;
          if (-1 < (long)uVar6) goto LAB_0010854e;
          break;
        case NGHTTP3_QPACK_ES_STATE_CHECK_VALUE_HUFFMAN:
          (decoder->rstate).huffman_encoded =
               (uint)((*src >> ((uint)(decoder->rstate).prefix & 0x1f) & 1) != 0);
          decoder->state = NGHTTP3_QPACK_ES_STATE_READ_VALUELEN;
          (decoder->rstate).left = 0;
          (decoder->rstate).shift = 0;
        case NGHTTP3_QPACK_ES_STATE_READ_VALUELEN:
          nVar8 = qpack_read_varint(&rfin,rstate,src,end);
          if (nVar8 < 0) {
            uVar6 = 0xfffffe6e;
            if (nVar8 != -0x6c) {
              __assert_fail("NGHTTP3_ERR_QPACK_FATAL == nread",
                            "/workspace/llm4binary/github/license_c_cmakelists/ngtcp2[P]nghttp3/lib/nghttp3_qpack.c"
                            ,0xbbd,
                            "nghttp3_ssize nghttp3_qpack_decoder_read_encoder(nghttp3_qpack_decoder *, const uint8_t *, size_t)"
                           );
            }
            break;
          }
          src = src + nVar8;
          if (rfin == 0) goto LAB_00108734;
          uVar6 = (decoder->rstate).left;
          if (0x10000 < uVar6) goto LAB_0010873e;
          if ((decoder->rstate).huffman_encoded == 0) {
            decoder->state = NGHTTP3_QPACK_ES_STATE_READ_VALUE;
          }
          else {
            decoder->state = NGHTTP3_QPACK_ES_STATE_READ_VALUE_HUFFMAN;
            nghttp3_qpack_huffman_decode_context_init(&rstate->huffman_ctx);
            uVar6 = (decoder->rstate).left * 2;
          }
          ppnVar3 = local_38;
          uVar5 = nghttp3_rcbuf_new(local_38,uVar6 + 1,local_50);
          uVar6 = (ulong)uVar5;
          if (uVar5 != 0) break;
          nghttp3_buf_wrap_init(local_58,(*ppnVar3)->base,(*ppnVar3)->len);
          bVar2 = 1;
          end = local_40;
          goto switchD_001082e3_default;
        case NGHTTP3_QPACK_ES_STATE_READ_VALUE_HUFFMAN:
          nVar8 = qpack_read_huffman_string(rstate,local_58,src,end);
          if (nVar8 < 0) {
            uVar6 = 0xfffffe6e;
            if (nVar8 != -0x6c) {
              __assert_fail("NGHTTP3_ERR_QPACK_FATAL == nread",
                            "/workspace/llm4binary/github/license_c_cmakelists/ngtcp2[P]nghttp3/lib/nghttp3_qpack.c"
                            ,0xbe6,
                            "nghttp3_ssize nghttp3_qpack_decoder_read_encoder(nghttp3_qpack_decoder *, const uint8_t *, size_t)"
                           );
            }
          }
          else {
            src = src + nVar8;
            if ((decoder->rstate).left != 0) goto LAB_00108734;
            qpack_read_state_terminate_value(rstate);
            if (decoder->opcode != NGHTTP3_QPACK_ES_OPCODE_INSERT) {
              if (decoder->opcode != NGHTTP3_QPACK_ES_OPCODE_INSERT_INDEXED) {
                nghttp3_unreachable_fail
                          ("nghttp3_qpack.c",0xbfb,"nghttp3_qpack_decoder_read_encoder");
              }
              goto LAB_001085c5;
            }
LAB_001085cf:
            uVar5 = nghttp3_qpack_decoder_dtable_literal_add(decoder);
            uVar6 = (ulong)uVar5;
LAB_001085d7:
            if ((int)uVar6 == 0) {
LAB_001085df:
              decoder->state = NGHTTP3_QPACK_ES_STATE_OPCODE;
              nghttp3_qpack_read_state_reset(rstate);
              bVar2 = 0;
              goto switchD_001082e3_default;
            }
          }
          break;
        case NGHTTP3_QPACK_ES_STATE_READ_VALUE:
          uVar6 = qpack_read_string(rstate,local_58,src,end);
          if (-1 < (long)uVar6) {
            src = src + uVar6;
            if ((decoder->rstate).left != 0) goto LAB_00108734;
            qpack_read_state_terminate_value(rstate);
            if (decoder->opcode == NGHTTP3_QPACK_ES_OPCODE_INSERT) goto LAB_001085cf;
            if (decoder->opcode != NGHTTP3_QPACK_ES_OPCODE_INSERT_INDEXED) {
              nghttp3_unreachable_fail("nghttp3_qpack.c",0xc1c,"nghttp3_qpack_decoder_read_encoder")
              ;
            }
LAB_001085c5:
            uVar5 = nghttp3_qpack_decoder_dtable_indexed_add(decoder);
            uVar6 = (ulong)uVar5;
            goto LAB_001085d7;
          }
          break;
        default:
          goto switchD_001082e3_default;
        }
        (decoder->ctx).bad = '\x01';
        nVar8 = (nghttp3_ssize)(int)uVar6;
      }
    }
  }
  else {
    nVar8 = -0x6c;
  }
  return nVar8;
switchD_001082e3_caseD_0:
  nVar8 = (*(code *)(&DAT_00112bd8 + *(int *)(&DAT_00112bd8 + (ulong)(*src >> 5) * 4)))();
  return nVar8;
}

Assistant:

nghttp3_ssize nghttp3_qpack_decoder_read_encoder(nghttp3_qpack_decoder *decoder,
                                                 const uint8_t *src,
                                                 size_t srclen) {
  const uint8_t *p = src, *end;
  int rv;
  int busy = 0;
  const nghttp3_mem *mem = decoder->ctx.mem;
  nghttp3_ssize nread;
  int rfin;

  if (decoder->ctx.bad) {
    return NGHTTP3_ERR_QPACK_FATAL;
  }

  if (srclen == 0) {
    return 0;
  }

  decoder->uninterrupted_encoderlen += srclen;
  if (decoder->uninterrupted_encoderlen > NGHTTP3_QPACK_MAX_ENCODERLEN) {
    return NGHTTP3_ERR_QPACK_ENCODER_STREAM_ERROR;
  }

  end = src + srclen;

  for (; p != end || busy;) {
    busy = 0;
    switch (decoder->state) {
    case NGHTTP3_QPACK_ES_STATE_OPCODE:
      switch ((*p) & 0xe0) {
      case 0x80:
      case 0xa0:
      case 0xc0:
      case 0xe0:
        DEBUGF("qpack::decode: OPCODE_INSERT_INDEXED\n");
        decoder->opcode = NGHTTP3_QPACK_ES_OPCODE_INSERT_INDEXED;
        decoder->rstate.dynamic = !((*p) & 0x40);
        decoder->rstate.prefix = 6;
        decoder->state = NGHTTP3_QPACK_ES_STATE_READ_INDEX;

        break;
      case 0x40:
      case 0x60:
        DEBUGF("qpack::decode: OPCODE_INSERT\n");
        decoder->opcode = NGHTTP3_QPACK_ES_OPCODE_INSERT;
        decoder->rstate.dynamic = 0;
        decoder->rstate.prefix = 5;
        decoder->state = NGHTTP3_QPACK_ES_STATE_CHECK_NAME_HUFFMAN;

        break;
      case 0x20:
        DEBUGF("qpack::decode: OPCODE_SET_DTABLE_TABLE_CAP\n");
        decoder->opcode = NGHTTP3_QPACK_ES_OPCODE_SET_DTABLE_CAP;
        decoder->rstate.prefix = 5;
        decoder->state = NGHTTP3_QPACK_ES_STATE_READ_INDEX;

        break;
      default:
        DEBUGF("qpack::decode: OPCODE_DUPLICATE\n");
        decoder->opcode = NGHTTP3_QPACK_ES_OPCODE_DUPLICATE;
        decoder->rstate.dynamic = 1;
        decoder->rstate.prefix = 5;
        decoder->state = NGHTTP3_QPACK_ES_STATE_READ_INDEX;
      }
      break;
    case NGHTTP3_QPACK_ES_STATE_READ_INDEX:
      nread = qpack_read_varint(&rfin, &decoder->rstate, p, end);
      if (nread < 0) {
        assert(NGHTTP3_ERR_QPACK_FATAL == nread);
        rv = NGHTTP3_ERR_QPACK_ENCODER_STREAM_ERROR;
        goto fail;
      }

      p += nread;

      if (!rfin) {
        return p - src;
      }

      if (decoder->opcode == NGHTTP3_QPACK_ES_OPCODE_SET_DTABLE_CAP) {
        DEBUGF("qpack::decode: Set dtable capacity to %" PRIu64 "\n",
               decoder->rstate.left);
        rv = nghttp3_qpack_decoder_set_max_dtable_capacity(
          decoder, (size_t)decoder->rstate.left);
        if (rv != 0) {
          rv = NGHTTP3_ERR_QPACK_ENCODER_STREAM_ERROR;
          goto fail;
        }

        decoder->state = NGHTTP3_QPACK_ES_STATE_OPCODE;
        nghttp3_qpack_read_state_reset(&decoder->rstate);
        break;
      }

      rv = nghttp3_qpack_decoder_rel2abs(decoder, &decoder->rstate);
      if (rv < 0) {
        goto fail;
      }

      switch (decoder->opcode) {
      case NGHTTP3_QPACK_ES_OPCODE_DUPLICATE:
        rv = nghttp3_qpack_decoder_dtable_duplicate_add(decoder);
        if (rv != 0) {
          goto fail;
        }

        decoder->state = NGHTTP3_QPACK_ES_STATE_OPCODE;
        nghttp3_qpack_read_state_reset(&decoder->rstate);

        break;
      case NGHTTP3_QPACK_ES_OPCODE_INSERT_INDEXED:
        decoder->rstate.prefix = 7;
        decoder->state = NGHTTP3_QPACK_ES_STATE_CHECK_VALUE_HUFFMAN;

        break;
      default:
        nghttp3_unreachable();
      }

      break;
    case NGHTTP3_QPACK_ES_STATE_CHECK_NAME_HUFFMAN:
      qpack_read_state_check_huffman(&decoder->rstate, *p);
      decoder->state = NGHTTP3_QPACK_ES_STATE_READ_NAMELEN;
      decoder->rstate.left = 0;
      decoder->rstate.shift = 0;
      /* Fall through */
    case NGHTTP3_QPACK_ES_STATE_READ_NAMELEN:
      nread = qpack_read_varint(&rfin, &decoder->rstate, p, end);
      if (nread < 0) {
        assert(NGHTTP3_ERR_QPACK_FATAL == nread);
        rv = NGHTTP3_ERR_QPACK_ENCODER_STREAM_ERROR;
        goto fail;
      }

      p += nread;

      if (!rfin) {
        return p - src;
      }

      if (decoder->rstate.left > NGHTTP3_QPACK_MAX_NAMELEN) {
        rv = NGHTTP3_ERR_QPACK_HEADER_TOO_LARGE;
        goto fail;
      }

      if (decoder->rstate.huffman_encoded) {
        decoder->state = NGHTTP3_QPACK_ES_STATE_READ_NAME_HUFFMAN;
        nghttp3_qpack_huffman_decode_context_init(&decoder->rstate.huffman_ctx);
        rv = nghttp3_rcbuf_new(&decoder->rstate.name,
                               (size_t)decoder->rstate.left * 2 + 1, mem);
      } else {
        decoder->state = NGHTTP3_QPACK_ES_STATE_READ_NAME;
        rv = nghttp3_rcbuf_new(&decoder->rstate.name,
                               (size_t)decoder->rstate.left + 1, mem);
      }
      if (rv != 0) {
        goto fail;
      }

      nghttp3_buf_wrap_init(&decoder->rstate.namebuf,
                            decoder->rstate.name->base,
                            decoder->rstate.name->len);
      break;
    case NGHTTP3_QPACK_ES_STATE_READ_NAME_HUFFMAN:
      nread = qpack_read_huffman_string(&decoder->rstate,
                                        &decoder->rstate.namebuf, p, end);
      if (nread < 0) {
        assert(NGHTTP3_ERR_QPACK_FATAL == nread);
        rv = NGHTTP3_ERR_QPACK_ENCODER_STREAM_ERROR;
        goto fail;
      }

      p += nread;

      if (decoder->rstate.left) {
        return p - src;
      }

      qpack_read_state_terminate_name(&decoder->rstate);

      decoder->state = NGHTTP3_QPACK_ES_STATE_CHECK_VALUE_HUFFMAN;
      decoder->rstate.prefix = 7;
      break;
    case NGHTTP3_QPACK_ES_STATE_READ_NAME:
      nread =
        qpack_read_string(&decoder->rstate, &decoder->rstate.namebuf, p, end);
      if (nread < 0) {
        rv = (int)nread;
        goto fail;
      }

      p += nread;

      if (decoder->rstate.left) {
        return p - src;
      }

      qpack_read_state_terminate_name(&decoder->rstate);

      decoder->state = NGHTTP3_QPACK_ES_STATE_CHECK_VALUE_HUFFMAN;
      decoder->rstate.prefix = 7;
      break;
    case NGHTTP3_QPACK_ES_STATE_CHECK_VALUE_HUFFMAN:
      qpack_read_state_check_huffman(&decoder->rstate, *p);
      decoder->state = NGHTTP3_QPACK_ES_STATE_READ_VALUELEN;
      decoder->rstate.left = 0;
      decoder->rstate.shift = 0;
      /* Fall through */
    case NGHTTP3_QPACK_ES_STATE_READ_VALUELEN:
      nread = qpack_read_varint(&rfin, &decoder->rstate, p, end);
      if (nread < 0) {
        assert(NGHTTP3_ERR_QPACK_FATAL == nread);
        rv = NGHTTP3_ERR_QPACK_ENCODER_STREAM_ERROR;
        goto fail;
      }

      p += nread;

      if (!rfin) {
        return p - src;
      }

      if (decoder->rstate.left > NGHTTP3_QPACK_MAX_VALUELEN) {
        rv = NGHTTP3_ERR_QPACK_HEADER_TOO_LARGE;
        goto fail;
      }

      if (decoder->rstate.huffman_encoded) {
        decoder->state = NGHTTP3_QPACK_ES_STATE_READ_VALUE_HUFFMAN;
        nghttp3_qpack_huffman_decode_context_init(&decoder->rstate.huffman_ctx);
        rv = nghttp3_rcbuf_new(&decoder->rstate.value,
                               (size_t)decoder->rstate.left * 2 + 1, mem);
      } else {
        decoder->state = NGHTTP3_QPACK_ES_STATE_READ_VALUE;
        rv = nghttp3_rcbuf_new(&decoder->rstate.value,
                               (size_t)decoder->rstate.left + 1, mem);
      }
      if (rv != 0) {
        goto fail;
      }

      nghttp3_buf_wrap_init(&decoder->rstate.valuebuf,
                            decoder->rstate.value->base,
                            decoder->rstate.value->len);

      /* value might be 0 length */
      busy = 1;
      break;
    case NGHTTP3_QPACK_ES_STATE_READ_VALUE_HUFFMAN:
      nread = qpack_read_huffman_string(&decoder->rstate,
                                        &decoder->rstate.valuebuf, p, end);
      if (nread < 0) {
        assert(NGHTTP3_ERR_QPACK_FATAL == nread);
        rv = NGHTTP3_ERR_QPACK_ENCODER_STREAM_ERROR;
        goto fail;
      }

      p += nread;

      if (decoder->rstate.left) {
        return p - src;
      }

      qpack_read_state_terminate_value(&decoder->rstate);

      switch (decoder->opcode) {
      case NGHTTP3_QPACK_ES_OPCODE_INSERT_INDEXED:
        rv = nghttp3_qpack_decoder_dtable_indexed_add(decoder);
        break;
      case NGHTTP3_QPACK_ES_OPCODE_INSERT:
        rv = nghttp3_qpack_decoder_dtable_literal_add(decoder);
        break;
      default:
        nghttp3_unreachable();
      }
      if (rv != 0) {
        goto fail;
      }

      decoder->state = NGHTTP3_QPACK_ES_STATE_OPCODE;
      nghttp3_qpack_read_state_reset(&decoder->rstate);
      break;
    case NGHTTP3_QPACK_ES_STATE_READ_VALUE:
      nread =
        qpack_read_string(&decoder->rstate, &decoder->rstate.valuebuf, p, end);
      if (nread < 0) {
        rv = (int)nread;
        goto fail;
      }

      p += nread;

      if (decoder->rstate.left) {
        return p - src;
      }

      qpack_read_state_terminate_value(&decoder->rstate);

      switch (decoder->opcode) {
      case NGHTTP3_QPACK_ES_OPCODE_INSERT_INDEXED:
        rv = nghttp3_qpack_decoder_dtable_indexed_add(decoder);
        break;
      case NGHTTP3_QPACK_ES_OPCODE_INSERT:
        rv = nghttp3_qpack_decoder_dtable_literal_add(decoder);
        break;
      default:
        nghttp3_unreachable();
      }
      if (rv != 0) {
        goto fail;
      }

      decoder->state = NGHTTP3_QPACK_ES_STATE_OPCODE;
      nghttp3_qpack_read_state_reset(&decoder->rstate);
      break;
    }
  }

  return p - src;

fail:
  decoder->ctx.bad = 1;
  return rv;
}